

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gzputs(gzFile file,char *str)

{
  size_t sVar1;
  int local_24;
  uint len;
  int ret;
  char *str_local;
  gzFile file_local;
  
  sVar1 = strlen(str);
  local_24 = gzwrite(file,str,(uint)sVar1);
  if ((local_24 == 0) && ((uint)sVar1 != 0)) {
    local_24 = -1;
  }
  return local_24;
}

Assistant:

int ZEXPORT gzputs(gzFile file, const char *str)
{
    int ret;
    unsigned len;

    /* write string */
    len = (unsigned)strlen(str);
    ret = gzwrite(file, str, len);
    return ret == 0 && len != 0 ? -1 : ret;
}